

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_round_2008_l_d_mips64el(CPUMIPSState_conflict10 *env,uint64_t fdt0)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  
  (env->active_fpu).fp_status.float_rounding_mode = '\0';
  uVar1 = float64_to_int64_mips64el(fdt0,&(env->active_fpu).fp_status);
  (env->active_fpu).fp_status.float_rounding_mode =
       (char)ieee_rm_mips64el[(env->active_fpu).fcr31 & 3];
  uVar2 = 0;
  if ((fdt0 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
    uVar2 = uVar1;
  }
  if (((env->active_fpu).fp_status.float_exception_flags & 1) != 0) {
    uVar1 = uVar2;
  }
  update_fcr31(env,unaff_retaddr);
  return uVar1;
}

Assistant:

uint64_t helper_float_round_2008_l_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint64_t dt2;

    set_float_rounding_mode(float_round_nearest_even,
            &env->active_fpu.fp_status);
    dt2 = float64_to_int64(fdt0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float64_is_any_nan(fdt0)) {
            dt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return dt2;
}